

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O0

void __thiscall FuncInfo::StartRecordingOutArgs(FuncInfo *this,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint *puVar4;
  uint uVar5;
  uint outArgsCount;
  uint argCount_local;
  FuncInfo *this_local;
  
  this->outArgsDepth = this->outArgsDepth + 1;
  if (argCount != (argCount & 0xffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x25e,"(argCount == (Js::ArgSlot)argCount)",
                       "argCount == (Js::ArgSlot)argCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  uVar5 = argCount + 1;
  this->outArgsCurrentExpr = (uVar5 & 0xffff) + this->outArgsCurrentExpr;
  if (((uVar5 & 0xffff) == uVar5) && (uVar5 <= this->outArgsCurrentExpr)) {
    puVar4 = max<unsigned_int>(&this->outArgsMaxDepth,&this->outArgsCurrentExpr);
    this->outArgsMaxDepth = *puVar4;
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

void StartRecordingOutArgs(unsigned int argCount)
    {
#if DBG
        outArgsDepth++;
#endif
        // We should have checked for argCount overflow already
        Assert(argCount == (Js::ArgSlot)argCount);

        // Add one for the space to save the m_outParams pointer in InterpreterStackFrame::PushOut
        unsigned int outArgsCount = argCount + 1;
        outArgsCurrentExpr += (Js::ArgSlot)outArgsCount;

        // Check for overflow
        if ((Js::ArgSlot)outArgsCount != outArgsCount || outArgsCurrentExpr < outArgsCount)
        {
            Js::Throw::OutOfMemory();
        }
        outArgsMaxDepth = max(outArgsMaxDepth, outArgsCurrentExpr);
    }